

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O3

void build_succ_ci(s3wid_t w,int32 append_filler,s3cipid_t *succ_ci)

{
  uint uVar1;
  dictword_t *pdVar2;
  s3wid_t *psVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  
  uVar1 = mdef->n_ciphone;
  if (0 < (int)uVar1) {
    memset(succ_ci,0,(ulong)uVar1 * 2);
  }
  if (-1 < w) {
    pdVar2 = dict->word;
    do {
      succ_ci[(uint)(int)*pdVar2[(uint)w].ciphone] = 1;
      w = pdVar2[(uint)w].alt;
    } while (-1 < w);
  }
  psVar3 = fillwid;
  if (append_filler != 0) {
    uVar8 = *fillwid;
    if (-1 < (int)uVar8) {
      pdVar2 = dict->word;
      lVar7 = 0;
      do {
        do {
          succ_ci[(uint)(int)*pdVar2[uVar8].ciphone] = 1;
          uVar8 = pdVar2[uVar8].alt;
        } while (-1 < (int)uVar8);
        uVar8 = psVar3[lVar7 + 1];
        lVar7 = lVar7 + 1;
      } while (-1 < (int)uVar8);
    }
  }
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar6 = 0;
    do {
      if (succ_ci[uVar6] != 0) {
        iVar4 = (int)uVar5;
        uVar5 = (ulong)(iVar4 + 1);
        succ_ci[iVar4] = (s3cipid_t)uVar6;
      }
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
    uVar5 = (ulong)(int)uVar5;
  }
  succ_ci[uVar5] = -1;
  return;
}

Assistant:

static void
build_succ_ci(s3wid_t w, int32 append_filler, s3cipid_t * succ_ci)
{
    int32 i, p;

    for (p = 0; p < mdef->n_ciphone; p++)
        succ_ci[p] = 0;

    for (; IS_S3WID(w); w = dict->word[w].alt)
        succ_ci[(unsigned) dict->word[w].ciphone[0]] = 1;

    if (append_filler) {
        for (i = 0; IS_S3WID(fillwid[i]); i++)
            for (w = fillwid[i]; IS_S3WID(w); w = dict->word[w].alt)
                succ_ci[(unsigned) dict->word[w].ciphone[0]] = 1;
    }

    i = 0;
    for (p = 0; p < mdef->n_ciphone; p++) {
        if (succ_ci[p])
            succ_ci[i++] = p;
    }
    succ_ci[i] = BAD_S3CIPID;
}